

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O0

optional<markdown::LinkIds::Target> * __thiscall
markdown::LinkIds::find
          (optional<markdown::LinkIds::Target> *__return_storage_ptr__,LinkIds *this,string *id)

{
  bool bVar1;
  value_type *pvVar2;
  c_iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>_>
  local_80 [3];
  string local_68;
  string local_48;
  c_iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>_>
  local_28;
  const_iterator i;
  string *id_local;
  LinkIds *this_local;
  
  i.node_ = (node_pointer)id;
  std::__cxx11::string::string((string *)&local_68,(string *)id);
  _scrubKey(&local_48,&local_68);
  local_28.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>_>
       ::find(&this->mTable,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  local_80[0].node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>_>
       ::end(&this->mTable);
  bVar1 = boost::unordered::iterator_detail::operator!=(&local_28,local_80);
  if (bVar1) {
    pvVar2 = boost::unordered::iterator_detail::
             c_iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>_>
             ::operator->(&local_28);
    boost::optional<markdown::LinkIds::Target>::optional(__return_storage_ptr__,&pvVar2->second);
  }
  else {
    boost::optional<markdown::LinkIds::Target>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<LinkIds::Target> LinkIds::find(const std::string& id) const {
	Table::const_iterator i=mTable.find(_scrubKey(id));
	if (i!=mTable.end()) return i->second;
	else return none;
}